

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O1

Hop_Obj_t * Ver_FormulaParserTopOper(Hop_Man_t *pMan,Vec_Ptr_t *vStackFn,int Oper)

{
  uint uVar1;
  Hop_Obj_t *p0;
  Hop_Obj_t *pHVar2;
  void **ppvVar3;
  int iVar4;
  
  iVar4 = vStackFn->nSize;
  if (0 < iVar4) {
    ppvVar3 = vStackFn->pArray;
    vStackFn->nSize = iVar4 - 1U;
    if (iVar4 != 1) {
      pHVar2 = (Hop_Obj_t *)ppvVar3[iVar4 - 1U];
      vStackFn->nSize = iVar4 - 2U;
      if (4 < Oper - 2U) {
        return (Hop_Obj_t *)0x0;
      }
      p0 = (Hop_Obj_t *)ppvVar3[iVar4 - 2U];
      switch(Oper) {
      case 2:
        if (iVar4 < 3) goto LAB_00853254;
        vStackFn->nSize = iVar4 - 3U;
        pHVar2 = Hop_Mux(pMan,(Hop_Obj_t *)ppvVar3[iVar4 - 3U],p0,pHVar2);
        break;
      case 3:
        pHVar2 = Hop_Exor(pMan,p0,pHVar2);
        pHVar2 = (Hop_Obj_t *)((ulong)pHVar2 ^ 1);
        break;
      case 4:
        pHVar2 = Hop_Or(pMan,p0,pHVar2);
        break;
      case 5:
        pHVar2 = Hop_Exor(pMan,p0,pHVar2);
        break;
      case 6:
        pHVar2 = Hop_And(pMan,p0,pHVar2);
      }
      uVar1 = vStackFn->nCap;
      if (vStackFn->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (vStackFn->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(vStackFn->pArray,0x80);
          }
          iVar4 = 0x10;
        }
        else {
          iVar4 = uVar1 * 2;
          if (iVar4 <= (int)uVar1) goto LAB_0085322f;
          if (vStackFn->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(vStackFn->pArray,(ulong)uVar1 << 4);
          }
        }
        vStackFn->pArray = ppvVar3;
        vStackFn->nCap = iVar4;
      }
LAB_0085322f:
      iVar4 = vStackFn->nSize;
      vStackFn->nSize = iVar4 + 1;
      vStackFn->pArray[iVar4] = pHVar2;
      return pHVar2;
    }
  }
LAB_00853254:
  __assert_fail("p->nSize > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                ,0x2cc,"void *Vec_PtrPop(Vec_Ptr_t *)");
}

Assistant:

Hop_Obj_t * Ver_FormulaParserTopOper( Hop_Man_t * pMan, Vec_Ptr_t * vStackFn, int Oper )
{
    Hop_Obj_t * bArg0, * bArg1, * bArg2, * bFunc;
    // perform the given operation
    bArg2 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
    bArg1 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
    if ( Oper == VER_PARSE_OPER_AND )
        bFunc = Hop_And( pMan, bArg1, bArg2 );
    else if ( Oper == VER_PARSE_OPER_XOR )
        bFunc = Hop_Exor( pMan, bArg1, bArg2 );
    else if ( Oper == VER_PARSE_OPER_OR )
        bFunc = Hop_Or( pMan, bArg1, bArg2 );
    else if ( Oper == VER_PARSE_OPER_EQU )
        bFunc = Hop_Not( Hop_Exor( pMan, bArg1, bArg2 ) );
    else if ( Oper == VER_PARSE_OPER_MUX )
    {
        bArg0 = (Hop_Obj_t *)Vec_PtrPop( vStackFn );
//        bFunc = Cudd_bddIte( dd, bArg0, bArg1, bArg2 );  Cudd_Ref( bFunc );
        bFunc = Hop_Mux( pMan, bArg0, bArg1, bArg2 ); 
//        Cudd_RecursiveDeref( dd, bArg0 );
//        Cudd_Deref( bFunc );
    }
    else
        return NULL;
//    Cudd_Ref( bFunc );
//    Cudd_RecursiveDeref( dd, bArg1 );
//    Cudd_RecursiveDeref( dd, bArg2 );
    Vec_PtrPush( vStackFn,  bFunc );
    return bFunc;
}